

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

__sighandler_t __thiscall
r_exec::SRMonitor::signal(SRMonitor *this,int __sig,__sighandler_t __handler)

{
  PrimaryMDLController *this_00;
  HLPBindingMap *bm;
  bool bVar1;
  uint uVar2;
  Goal *pGVar3;
  _func_int **pp_Var4;
  _Object *p_Var5;
  undefined8 uVar6;
  _Object *p_Var7;
  MDLController *pMVar8;
  
  uVar2 = (*((this->super_SGMonitor).super__GMonitor.super_Monitor.target.object)->_vptr__Object
            [0xe])();
  if ((char)uVar2 == '\0') {
    this_00 = (PrimaryMDLController *)
              (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
    bm = (HLPBindingMap *)(this->super_SGMonitor).super__GMonitor.super_Monitor.bindings.object;
    p_Var5 = (this->super_SGMonitor).super__GMonitor.super_Monitor.target.object;
    if ((char)__sig == '\0') {
      bVar1 = PrimaryMDLController::check_simulated_imdl
                        (this_00,(Fact *)p_Var5,bm,(Controller *)0x0);
      if (!bVar1) goto LAB_0016a2f0;
      p_Var7 = (this->super_SGMonitor).super__GMonitor.super_Monitor.target.object;
      pMVar8 = (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
      pp_Var4 = (pMVar8->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object;
      uVar6 = 0;
      p_Var5 = (_Object *)0x0;
    }
    else {
      pGVar3 = _Fact::get_goal((_Fact *)p_Var5);
      bVar1 = PrimaryMDLController::check_simulated_imdl
                        (this_00,(Fact *)p_Var5,bm,
                         (Controller *)(pGVar3->sim).object[3]._vptr__Object);
      if (!bVar1) goto LAB_0016a2f0;
      p_Var5 = (this->super_SGMonitor).super__GMonitor.super_Monitor.target.object;
      pMVar8 = (this->super_SGMonitor).super__GMonitor.super_Monitor.controller;
      pp_Var4 = (pMVar8->super_HLPController).super_OController.super_Controller.super__Object.
                _vptr__Object;
      uVar6 = 1;
      p_Var7 = p_Var5;
    }
    (*pp_Var4[0x10])(pMVar8,p_Var7,uVar6,p_Var5);
  }
LAB_0016a2f0:
  return (__sighandler_t)(ulong)uVar2;
}

Assistant:

bool SRMonitor::signal(bool simulation)
{
    if (target->is_invalidated()) {
        return true;
    }

    if (simulation) {
        if (((PrimaryMDLController *)controller)->check_simulated_imdl(target, bindings, target->get_goal()->sim->root)) {
            ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, target);    // report a simulated success.
        }
    } else {
        if (((PrimaryMDLController *)controller)->check_simulated_imdl(target, bindings, nullptr)) {
            ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, nullptr);    // report a simulated failure.
        }
    }

    return false;
}